

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

clip_image_size
llava_uhd::select_best_resolution
          (clip_image_size *original_size,
          vector<clip_image_size,_std::allocator<clip_image_size>_> *possible_resolutions)

{
  int iVar1;
  bool bVar2;
  float *pfVar3;
  int *piVar4;
  undefined8 in_RSI;
  int *in_RDI;
  int wasted_resolution;
  int effective_resolution;
  int downscaled_height;
  int downscaled_width;
  float scale;
  int height;
  int width;
  clip_image_size *resolution;
  const_iterator __end1;
  const_iterator __begin1;
  vector<clip_image_size,_std::allocator<clip_image_size>_> *__range1;
  int min_wasted_resolution;
  int max_effective_resolution;
  int original_height;
  int original_width;
  clip_image_size best_fit;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  float local_5c;
  float local_58;
  float local_54;
  int local_50;
  int local_4c;
  reference local_48;
  clip_image_size *local_40;
  __normal_iterator<const_clip_image_size_*,_std::vector<clip_image_size,_std::allocator<clip_image_size>_>_>
  local_38;
  undefined8 local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined8 local_18;
  clip_image_size local_8;
  
  local_1c = *in_RDI;
  local_20 = in_RDI[1];
  local_24 = 0;
  local_18 = in_RSI;
  local_28 = std::numeric_limits<int>::max();
  local_30 = local_18;
  local_38._M_current =
       (clip_image_size *)
       std::vector<clip_image_size,_std::allocator<clip_image_size>_>::begin
                 ((vector<clip_image_size,_std::allocator<clip_image_size>_> *)
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_40 = (clip_image_size *)
             std::vector<clip_image_size,_std::allocator<clip_image_size>_>::end
                       ((vector<clip_image_size,_std::allocator<clip_image_size>_> *)
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_clip_image_size_*,_std::vector<clip_image_size,_std::allocator<clip_image_size>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (__normal_iterator<const_clip_image_size_*,_std::vector<clip_image_size,_std::allocator<clip_image_size>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (!bVar2) break;
    local_48 = __gnu_cxx::
               __normal_iterator<const_clip_image_size_*,_std::vector<clip_image_size,_std::allocator<clip_image_size>_>_>
               ::operator*(&local_38);
    local_4c = local_48->width;
    local_50 = local_48->height;
    local_58 = (float)local_4c / (float)local_1c;
    local_5c = (float)local_50 / (float)local_20;
    pfVar3 = std::min<float>(&local_58,&local_5c);
    local_54 = *pfVar3;
    in_stack_ffffffffffffff94 =
         (int)((float)local_1c * local_54) * (int)((float)local_20 * local_54);
    in_stack_ffffffffffffff90 = local_1c * local_20;
    piVar4 = std::min<int>((int *)&stack0xffffffffffffff94,(int *)&stack0xffffffffffffff90);
    iVar1 = *piVar4;
    in_stack_ffffffffffffff8c = local_4c * local_50 - iVar1;
    if ((local_24 < iVar1) || ((iVar1 == local_24 && (in_stack_ffffffffffffff8c < local_28)))) {
      local_8 = *local_48;
      local_28 = in_stack_ffffffffffffff8c;
      local_24 = iVar1;
    }
    __gnu_cxx::
    __normal_iterator<const_clip_image_size_*,_std::vector<clip_image_size,_std::allocator<clip_image_size>_>_>
    ::operator++(&local_38);
  }
  return local_8;
}

Assistant:

static clip_image_size select_best_resolution(const clip_image_size & original_size, const std::vector<clip_image_size> & possible_resolutions) {
        int original_width = original_size.width;
        int original_height = original_size.height;
        clip_image_size best_fit;
        int max_effective_resolution = 0;
        int min_wasted_resolution = std::numeric_limits<int>::max();

        for (const auto & resolution : possible_resolutions) {
            int width  = resolution.width;
            int height = resolution.height;
            float scale = std::min(static_cast<float>(width) / original_width, static_cast<float>(height) / original_height);
            int downscaled_width  = static_cast<int>(original_width * scale);
            int downscaled_height = static_cast<int>(original_height * scale);
            int effective_resolution = std::min(downscaled_width * downscaled_height, original_width * original_height);
            int wasted_resolution = (width * height) - effective_resolution;
            // LOG_INF("resolution: %d %d, scale: %f, downscaled: %d %d, effective: %d, wasted: %d\n", width, height, scale, downscaled_width, downscaled_height, effective_resolution, wasted_resolution);
            if (effective_resolution > max_effective_resolution || (effective_resolution == max_effective_resolution && wasted_resolution < min_wasted_resolution)) {
                max_effective_resolution = effective_resolution;
                min_wasted_resolution = wasted_resolution;
                best_fit = resolution;
            }
        }

        return best_fit;
    }